

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_regexp_test(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int64_t iVar1;
  JSValueUnion JVar2;
  JSValue JVar3;
  
  JVar3 = JS_RegExpExec(ctx,this_val,*argv);
  if ((JVar3.tag & 0xffffffffU) == 6) {
    iVar1 = 6;
    JVar2.float64 = 0.0;
  }
  else {
    JVar2._1_7_ = 0;
    JVar2.int32._0_1_ = (int)JVar3.tag != 2;
    JS_FreeValue(ctx,JVar3);
    iVar1 = 1;
  }
  JVar3.tag = iVar1;
  JVar3.u.float64 = JVar2.float64;
  return JVar3;
}

Assistant:

static JSValue js_regexp_test(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    JSValue val;
    BOOL ret;

    val = JS_RegExpExec(ctx, this_val, argv[0]);
    if (JS_IsException(val))
        return JS_EXCEPTION;
    ret = !JS_IsNull(val);
    JS_FreeValue(ctx, val);
    return JS_NewBool(ctx, ret);
}